

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_AActor_A_FreezeDeath
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  ulong uVar2;
  player_t *ppVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  AActor *pAVar7;
  AActor *this;
  char *__assertion;
  FSoundID local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004a6cba;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar4 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004a6cba;
        }
        goto LAB_004a6b70;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_004a6caa;
    this = (AActor *)0x0;
LAB_004a6b70:
    iVar5 = FRandom::operator()(&pr_freezedeath);
    iVar6 = FRandom::operator()(&pr_freezedeath);
    this->tics = iVar6 + iVar5 + 0x4b;
    uVar2._0_4_ = this->flags;
    uVar2._4_4_ = this->flags2;
    this->flags = (ActorFlags)(int)(uVar2 | 0x4160080080006);
    this->flags2 = (ActorFlags2)(int)((uVar2 | 0x4160080080006) >> 0x20);
    pbVar1 = (byte *)((long)&(this->flags3).Value + 2);
    *pbVar1 = *pbVar1 | 0x20;
    pAVar7 = AActor::GetDefault(this);
    this->Height = pAVar7->Height;
    if (((this->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
      this->RenderStyle = LegacyRenderStyles[1];
    }
    local_1c.ID = S_FindSound("misc/freeze");
    S_Sound(this,4,&local_1c,1.0,1.0);
    if (((this->flags).Value & 0x40000000) != 0) {
      this->Alpha = 1.0;
      this->visdir = '\0';
    }
    ppVar3 = this->player;
    if (ppVar3 == (player_t *)0x0) {
      if ((((this->flags3).Value & 0x2000) != 0) && (this->special != 0)) {
        P_ExecuteSpecial(this->special,(line_t *)0x0,this,false,this->args[0],this->args[1],
                         this->args[2],this->args[3],this->args[4]);
        this->special = 0;
      }
    }
    else {
      ppVar3->damagecount = 0;
      ppVar3->bonuscount = 0;
      ppVar3->poisoncount = 0;
    }
    return 0;
  }
LAB_004a6caa:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004a6cba:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x55,
                "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_SELF_PROLOGUE(AActor);

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}